

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O3

void __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
::solver_inequalities_101coeff
          (solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
           *this,random_engine *rng_,int m_,int n_,cost_type *c_,
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          *csts)

{
  value_bit_array<_1,_1> *this_00;
  pointer pmVar1;
  uint size;
  pointer pfVar2;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  int *piVar6;
  longdouble *plVar7;
  rc_data *__s;
  bound_factor *pbVar8;
  pointer pmVar9;
  undefined8 extraout_RAX;
  sparse_matrix<int> *this_01;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  *pvVar15;
  sparse_matrix<int> *psVar16;
  int index;
  ulong uVar17;
  pointer pfVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  
  (this->super_debug_logger<false>).ofs = (FILE *)0x0;
  this->rng = rng_;
  pvVar15 = csts;
  sparse_matrix<int>::sparse_matrix<baryonyx::itm::merged_constraint>(&this->ap,csts,m_,n_);
  size = (this->ap).m_rows_values.m_length;
  uVar17 = (ulong)size << 4;
  plVar7 = (longdouble *)operator_new__(uVar17);
  memset(plVar7,0,uVar17);
  (this->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this_00 = &this->A;
  bit_array_impl::bit_array_impl(&this_00->super_bit_array_impl,size);
  pmVar9 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar9;
  uVar17 = (long)*(pointer *)
                  ((long)&(pmVar9->elements).
                          super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                          ._M_impl + 8) -
           *(long *)&(pmVar9->elements).
                     super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                     ._M_impl >> 3;
  if (lVar13 != 0x28) {
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar24 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
    auVar26 = vpbroadcastq_avx512f();
    uVar17 = 0;
    auVar27 = vpbroadcastq_avx512f();
    do {
      auVar28 = vpbroadcastq_avx512f();
      auVar29 = vmovdqa64_avx512f(auVar26);
      vpmullq_avx512dq(auVar22,auVar24);
      uVar17 = uVar17 + 8;
      auVar22 = vpaddq_avx512f(auVar22,auVar25);
      auVar26 = vporq_avx512f(auVar28,auVar23);
      uVar5 = vpcmpuq_avx512f(auVar26,auVar27,2);
      auVar26 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)((long)&(pmVar9->elements).
                                                                                                      
                                                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                                  ._M_impl + 8U) + (long)pvVar15));
      bVar3 = (byte)uVar5;
      auVar28._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar26._8_8_;
      auVar28._0_8_ = (ulong)(bVar3 & 1) * auVar26._0_8_;
      auVar28._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar26._16_8_;
      auVar28._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar26._24_8_;
      auVar28._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar26._32_8_;
      auVar28._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar26._40_8_;
      auVar28._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar26._48_8_;
      auVar28._56_8_ = (uVar5 >> 7) * auVar26._56_8_;
      auVar26 = vpgatherqq_avx512f(*(undefined8 *)
                                    ((long)&(pvVar15->
                                            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                            )._M_impl.super__Vector_impl_data +
                                    (long)&(pmVar9->elements).
                                           super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                           ._M_impl));
      auVar30._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar26._8_8_;
      auVar30._0_8_ = (ulong)(bVar3 & 1) * auVar26._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar26._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar26._24_8_;
      auVar30._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar26._32_8_;
      auVar30._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar26._40_8_;
      auVar30._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar26._48_8_;
      auVar30._56_8_ = (uVar5 >> 7) * auVar26._56_8_;
      auVar26 = vpsubq_avx512f(auVar28,auVar30);
      auVar26 = vpsraq_avx512f(auVar26,3);
      auVar26 = vpmaxuq_avx512f(auVar29,auVar26);
    } while (((lVar13 >> 3) * -0x3333333333333333 + 6U & 0xfffffffffffffff8) != uVar17);
    auVar22 = vmovdqa64_avx512f(auVar26);
    auVar23._0_8_ = (ulong)(bVar3 & 1) * auVar22._0_8_ | (ulong)!(bool)(bVar3 & 1) * auVar29._0_8_;
    bVar4 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar23._8_8_ = (ulong)bVar4 * auVar22._8_8_ | (ulong)!bVar4 * auVar29._8_8_;
    bVar4 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar23._16_8_ = (ulong)bVar4 * auVar22._16_8_ | (ulong)!bVar4 * auVar29._16_8_;
    bVar4 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar23._24_8_ = (ulong)bVar4 * auVar22._24_8_ | (ulong)!bVar4 * auVar29._24_8_;
    bVar4 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar23._32_8_ = (ulong)bVar4 * auVar22._32_8_ | (ulong)!bVar4 * auVar29._32_8_;
    bVar4 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar23._40_8_ = (ulong)bVar4 * auVar22._40_8_ | (ulong)!bVar4 * auVar29._40_8_;
    bVar4 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar23._48_8_ = (ulong)bVar4 * auVar22._48_8_ | (ulong)!bVar4 * auVar29._48_8_;
    auVar23._56_8_ = (uVar5 >> 7) * auVar22._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar29._56_8_;
    auVar21 = vextracti64x4_avx512f(auVar23,1);
    auVar22 = vpmaxuq_avx512f(auVar23,ZEXT3264(auVar21));
    auVar19 = vpmaxuq_avx512vl(auVar22._0_16_,auVar22._16_16_);
    auVar20 = vpshufd_avx(auVar19,0xee);
    auVar20 = vpmaxuq_avx512vl(auVar19,auVar20);
    uVar17 = auVar20._0_8_;
  }
  uVar17 = -(ulong)(uVar17 >> 0x3b != 0) | uVar17 << 5;
  __s = (rc_data *)operator_new__(uVar17);
  memset(__s,0,uVar17);
  (this->R)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
  ._M_head_impl = __s;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = (long)m_;
  uVar17 = SUB168(auVar20 * ZEXT816(0xc),0);
  if (SUB168(auVar20 * ZEXT816(0xc),8) != 0) {
    uVar17 = 0xffffffffffffffff;
  }
  pbVar8 = (bound_factor *)operator_new__(uVar17);
  memset(pbVar8,0,uVar17);
  uVar17 = (long)m_ << 4;
  (this->b)._M_t.
  super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
  .
  super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
  ._M_head_impl = pbVar8;
  if (m_ < 0) {
    uVar17 = 0xffffffffffffffff;
  }
  plVar7 = (longdouble *)operator_new__(uVar17);
  index = 0;
  memset(plVar7,0,uVar17);
  (this->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
  super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
  super__Head_base<0UL,_long_double_*,_false>._M_head_impl = plVar7;
  this->c = c_;
  this->m = m_;
  this->n = n_;
  pmVar9 = (csts->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar17 = ((long)(csts->
                  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pmVar9 >> 3) *
           -0x3333333333333333;
  if ((int)uVar17 != 0) {
    this_01 = (sparse_matrix<int> *)(uVar17 & 0xffffffff);
    psVar16 = (sparse_matrix<int> *)0x0;
    do {
      pfVar18 = *(pointer *)
                 &pmVar9[(long)psVar16].elements.
                  super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                  ._M_impl;
      pfVar2 = *(pointer *)
                ((long)&pmVar9[(long)psVar16].elements.
                        super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                        ._M_impl + 8);
      if (pfVar18 == pfVar2) {
        uVar17 = 0;
        iVar11 = 0;
      }
      else {
        iVar11 = 0;
        uVar17 = 0;
        do {
          if ((pfVar18->factor + 1U & 0xfffffffd) != 0) {
            itm::solver_inequalities_101coeff();
            goto LAB_004c6fd0;
          }
          if (pfVar18->factor < 1) {
            bit_array_impl::unset(&this_00->super_bit_array_impl,index);
          }
          else {
            bit_array_impl::set(&this_00->super_bit_array_impl,index);
          }
          index = index + 1;
          piVar6 = &pfVar18->factor;
          pfVar18 = pfVar18 + 1;
          uVar17 = (ulong)((int)uVar17 + (uint)(0 < *piVar6));
          iVar11 = iVar11 + (uint)(*piVar6 < 1);
        } while (pfVar18 != pfVar2);
        pmVar9 = (csts->
                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      pmVar1 = pmVar9 + (long)psVar16;
      iVar14 = pmVar1->min;
      iVar10 = (int)uVar17;
      if (iVar14 == pmVar1->max) {
        pbVar8 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar8[(long)psVar16].min = iVar14;
        pbVar8[(long)psVar16].max = iVar14;
        pbVar8[(long)psVar16].negative_factor = iVar11;
      }
      else {
        iVar12 = -iVar11;
        if (iVar14 != iVar12 && SBORROW4(iVar14,iVar12) == iVar14 + iVar11 < 0) {
          iVar12 = iVar14;
        }
        pbVar8 = (this->b)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::bound_factor_*,_false>
                 ._M_head_impl;
        pbVar8[(long)psVar16].min = iVar12;
        iVar14 = pmVar1->max;
        if (iVar10 <= pmVar1->max) {
          iVar14 = iVar10;
        }
        pbVar8[(long)psVar16].max = iVar14;
        pbVar8[(long)psVar16].negative_factor = iVar11;
        if (iVar14 < iVar12) {
LAB_004c6fd0:
          itm::solver_inequalities_101coeff();
          goto LAB_004c6fd5;
        }
      }
      if (iVar11 + iVar10 !=
          (int)((ulong)((long)*(pointer *)
                               ((long)&(pmVar1->elements).
                                       super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                       ._M_impl + 8) -
                       *(long *)&(pmVar1->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl) >> 3)) {
LAB_004c6fd5:
        itm::solver_inequalities_101coeff();
        operator_delete__(pfVar2);
        *(undefined8 *)(uVar17 + 0x70) = 0;
        if (*(void **)(uVar17 + 0x68) != (void *)0x0) {
          operator_delete__(*(void **)(uVar17 + 0x68));
        }
        *(undefined8 *)(uVar17 + 0x68) = 0;
        if (*(void **)(uVar17 + 0x60) != (void *)0x0) {
          operator_delete__(*(void **)(uVar17 + 0x60));
        }
        *(undefined8 *)(uVar17 + 0x60) = 0;
        if (*(void **)(uVar17 + 0x50) != (void *)0x0) {
          operator_delete__(*(void **)(uVar17 + 0x50));
        }
        *(undefined8 *)(uVar17 + 0x50) = 0;
        sparse_matrix<int>::~sparse_matrix(this_01);
        _Unwind_Resume(extraout_RAX);
      }
      psVar16 = (sparse_matrix<int> *)
                ((long)&(psVar16->m_rows_access).m_buffer._M_t.
                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false> + 1);
    } while (psVar16 != this_01);
  }
  return;
}

Assistant:

solver_inequalities_101coeff(random_engine& rng_,
                                 int m_,
                                 int n_,
                                 const cost_type& c_,
                                 const std::vector<merged_constraint>& csts)
      : logger("solver_inequalities_101coeff")
      , rng(rng_)
      , ap(csts, m_, n_)
      , P(std::make_unique<Float[]>(ap.size()))
      , A(static_cast<int>(ap.size()))
      , R(std::make_unique<rc_data[]>(compute_reduced_costs_vector_size(csts)))
      , b(std::make_unique<bound_factor[]>(m_))
      , pi(std::make_unique<Float[]>(m_))
      , c(c_)
      , m(m_)
      , n(n_)
    {
        int id = 0;
        for (int i = 0, e = length(csts); i != e; ++i) {
            int lower = 0, upper = 0;

            for (const auto& cst : csts[i].elements) {
                bx_ensures(std::abs(cst.factor) == 1);

                if (cst.factor > 0)
                    A.set(id++);
                else
                    A.unset(id++);

                if (cst.factor > 0)
                    upper++;
                else
                    lower++;
            }

            if (csts[i].min == csts[i].max) {
                b[i].min = csts[i].min;
                b[i].max = csts[i].max;
            } else {
                b[i].min = std::max(-lower, csts[i].min);
                b[i].max = std::min(upper, csts[i].max);
            }

            b[i].negative_factor = lower;

            bx_ensures(b[i].min <= b[i].max);
            bx_ensures(upper + lower == length(csts[i].elements));
        }
    }